

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int get_sig_seg_size(rtr_signature_seg *sig_segs,align_type type)

{
  int iVar1;
  long in_FS_OFFSET;
  
  iVar1 = 0;
  if (sig_segs != (rtr_signature_seg *)0x0) {
    if (type == VALIDATION) {
      sig_segs = sig_segs->next;
    }
    iVar1 = 0;
    if (sig_segs != (rtr_signature_seg *)0x0) {
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)sig_segs->sig_len + 0x16;
        sig_segs = sig_segs->next;
      } while (sig_segs != (rtr_signature_seg *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int get_sig_seg_size(const struct rtr_signature_seg *sig_segs, enum align_type type)
{
	unsigned int sig_segs_size = 0;

	if (!sig_segs)
		return 0;

	/* Iterate over all signature segments and add the calculated
	 * length to sig_segs_size. Return the sum at the end.
	 */
	const struct rtr_signature_seg *curr = sig_segs;

	if (type == VALIDATION)
		curr = curr->next;

	while (curr) {
		sig_segs_size += curr->sig_len + sizeof(curr->sig_len) + SKI_SIZE;
		curr = curr->next;
	}

	return sig_segs_size;
}